

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunction * duckdb::Log2Fun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *function;
  allocator_type *in_stack_fffffffffffffe08;
  BaseScalarFunction *function_00;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe10;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  LogicalType *local_188;
  BaseScalarFunction local_168 [176];
  LogicalType local_b8 [24];
  undefined1 local_a0 [32];
  LogicalType local_80 [40];
  LogicalType *local_58;
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_58 = local_50;
  duckdb::LogicalType::LogicalType(local_58,DOUBLE);
  local_38 = local_50;
  local_30 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xdc8e74);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffe20;
  iVar1._M_array = (iterator)in_stack_fffffffffffffe18;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffe24;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe10,iVar1,in_stack_fffffffffffffe08);
  duckdb::LogicalType::LogicalType(local_80,DOUBLE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
            );
  duckdb::LogicalType::LogicalType(local_b8,INVALID);
  function_00 = (BaseScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_28,local_80,local_a0,0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xdc8f4e);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdc8f68);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xdc8f75);
  local_188 = (LogicalType *)&local_38;
  do {
    local_188 = local_188 + -0x18;
    duckdb::LogicalType::~LogicalType(local_188);
  } while (local_188 != local_50);
  BaseScalarFunction::SetReturnsError(function_00);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_168);
  return in_RDI;
}

Assistant:

ScalarFunction Log2Fun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, Log2Operator>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}